

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_cwriter_create(Curl_cwriter **pwriter,Curl_easy *data,Curl_cwtype *cwt,
                            Curl_cwriter_phase phase)

{
  CURLcode CVar1;
  Curl_cwriter *pCVar2;
  Curl_cwriter *pCVar3;
  
  pCVar2 = (Curl_cwriter *)(*Curl_ccalloc)(1,cwt->cwriter_size);
  if (pCVar2 == (Curl_cwriter *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    pCVar2 = (Curl_cwriter *)0x0;
  }
  else {
    pCVar2->cwt = cwt;
    pCVar2->ctx = pCVar2;
    pCVar2->phase = phase;
    CVar1 = (*cwt->do_init)(data,pCVar2);
  }
  pCVar3 = (Curl_cwriter *)0x0;
  if (CVar1 == CURLE_OK) {
    pCVar3 = pCVar2;
  }
  *pwriter = pCVar3;
  if (CVar1 != CURLE_OK) {
    (*Curl_cfree)(pCVar2);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cwriter_create(struct Curl_cwriter **pwriter,
                                   struct Curl_easy *data,
                                   const struct Curl_cwtype *cwt,
                                   Curl_cwriter_phase phase)
{
  struct Curl_cwriter *writer = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  void *p;

  DEBUGASSERT(cwt->cwriter_size >= sizeof(struct Curl_cwriter));
  p = calloc(1, cwt->cwriter_size);
  if(!p)
    goto out;

  writer = (struct Curl_cwriter *)p;
  writer->cwt = cwt;
  writer->ctx = p;
  writer->phase = phase;
  result = cwt->do_init(data, writer);

out:
  *pwriter = result ? NULL : writer;
  if(result)
    free(writer);
  return result;
}